

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_process_altsvc_frame(nghttp2_session *session)

{
  uint16_t uVar1;
  int iVar2;
  nghttp2_frame *frame;
  nghttp2_inbound_frame *iframe;
  nghttp2_session *session_local;
  
  uVar1 = nghttp2_get_uint16((session->iframe).sbuf.pos);
  nghttp2_frame_unpack_altsvc_payload
            ((nghttp2_extension *)&session->iframe,(ulong)uVar1,(session->iframe).lbuf.pos,
             (long)(session->iframe).lbuf.last - (long)(session->iframe).lbuf.pos);
  nghttp2_buf_wrap_init(&(session->iframe).lbuf,(uint8_t *)0x0,0);
  iVar2 = nghttp2_session_on_altsvc_received(session,&(session->iframe).frame);
  return iVar2;
}

Assistant:

static int session_process_altsvc_frame(nghttp2_session *session) {
  nghttp2_inbound_frame *iframe = &session->iframe;
  nghttp2_frame *frame = &iframe->frame;

  nghttp2_frame_unpack_altsvc_payload(
      &frame->ext, nghttp2_get_uint16(iframe->sbuf.pos), iframe->lbuf.pos,
      nghttp2_buf_len(&iframe->lbuf));

  /* nghttp2_frame_unpack_altsvc_payload steals buffer from
     iframe->lbuf */
  nghttp2_buf_wrap_init(&iframe->lbuf, NULL, 0);

  return nghttp2_session_on_altsvc_received(session, frame);
}